

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

bool __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::Reduce
          (MI<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  _List_node_base **polyRight_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *pMVar4;
  _List_node_base *p_Var5;
  MM<8UL> lm;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  Geobucket<2UL> gb;
  MM<8UL> local_88;
  MP<8UL,_GF2::MOGrevlex<8UL>_> local_80;
  Geobucket<2UL> local_60;
  
  MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::Geobucket(&local_60,polyRight);
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
            (&polyRight->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  local_88.super_WW<8UL>._words[0] = (WW<8UL>)(word  [1])0x0;
  local_80.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size = 0;
  bVar2 = false;
  local_80.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_80.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
       super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  do {
    bVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::PopLM(&local_60,&local_88);
    p_Var5 = (_List_node_base *)this;
    if (!bVar1) {
      std::__cxx11::_List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::_M_clear
                ((_List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&local_80);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::~Geobucket(&local_60);
      return bVar2;
    }
    do {
      p_Var5 = (((MI<8UL,_GF2::MOGrevlex<8UL>_> *)p_Var5)->
               super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ).
               super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if ((p_Var5 == (_List_node_base *)this) ||
         (iVar3 = MOGrevlex<8UL>::Compare
                            ((MOGrevlex<8UL> *)&this->field_0x18,
                             (MM<8UL> *)(*(long *)(p_Var5 + 1) + 0x10),&local_88), 0 < iVar3))
      goto LAB_001426e2;
      polyRight_00 = &p_Var5[1]._M_next;
    } while ((*(ulong *)((long)*polyRight_00 + 0x10) & ~(ulong)local_88.super_WW<8UL>._words[0]) !=
             0);
    pMVar4 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator=
                       (&local_80,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)polyRight_00);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::pop_front
              (&pMVar4->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
    local_88.super_WW<8UL>._words[0] =
         (WW<8UL>)((ulong)local_88.super_WW<8UL>._words[0] & ~*(ulong *)((long)*polyRight_00 + 0x10)
                  );
    pMVar4 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator*=(&local_80,&local_88);
    MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::SymDiffSplice(&local_60,pMVar4);
    bVar2 = true;
    if (p_Var5 == (_List_node_base *)this) {
LAB_001426e2:
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
                (&polyRight->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,&local_88);
    }
  } while( true );
}

Assistant:

bool Reduce(MP<_n, _O>& polyRight) const
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(polyRight);
		// будем сохранять в polyRight остаток
		polyRight.SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				// делимость старших мономов?
				if (iterPoly->LM() | lm)
				{
					changed = true;
					// готовим множитель
					(poly = *iterPoly).PopLM();
					// перемножаем и добавляем в geobucket
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					// все сначала
					break;
				}
			}
			// lm не делится ни на один из старших многочленов системы,
			// поэтому заносим lm в остаток
			if (iterPoly == end()) polyRight.push_back(lm);
		}
		return changed;
	}